

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.hpp
# Opt level: O0

int __thiscall
qclab::io::QASMFile::
parse1const<qclab::qgates::PauliY<std::complex<float>>,qclab::QObject<std::complex<float>>>
          (QASMFile *this,string *name,string *command,
          unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
          *gate)

{
  __type _Var1;
  string *str;
  unique_ptr<qclab::qgates::PauliY<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliY<std::complex<float>_>_>_>
  local_98;
  int local_90;
  int qubit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined8 local_40;
  size_type n2;
  size_type n1;
  unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
  *gate_local;
  string *command_local;
  string *name_local;
  QASMFile *this_local;
  
  n1 = (size_type)gate;
  gate_local = (unique_ptr<qclab::QObject<std::complex<float>_>,_std::default_delete<qclab::QObject<std::complex<float>_>_>_>
                *)command;
  command_local = name;
  name_local = (string *)this;
  n2 = std::__cxx11::string::length();
  local_40 = std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)&local_60,(ulong)gate_local);
  std::operator+(&local_80,name,&this->qregName_);
  _Var1 = std::operator==(&local_60,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  if (_Var1) {
    str = (string *)std::__cxx11::string::erase((ulong)gate_local,0);
    local_90 = parseQubit(this,str);
    std::make_unique<qclab::qgates::PauliY<std::complex<float>>,int_const&>((int *)&local_98);
    std::
    unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
    ::operator=((unique_ptr<qclab::QObject<std::complex<float>>,std::default_delete<qclab::QObject<std::complex<float>>>>
                 *)n1,&local_98);
    std::
    unique_ptr<qclab::qgates::PauliY<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliY<std::complex<float>_>_>_>
    ::~unique_ptr(&local_98);
  }
  this_local._4_4_ = (uint)_Var1;
  return this_local._4_4_;
}

Assistant:

int parse1const( std::string name , std::string& command ,
                       std::unique_ptr< GATE >& gate ) const {
        const auto n1 = name.length() ;
        const auto n2 = qregName_.length() ;
        if ( command.substr( 0 , n1 + n2 ) == name + qregName_ ) {
          const auto qubit = parseQubit( command.erase( 0 , n1 + n2 + 1 ) ) ;
          gate = std::make_unique< G >( qubit ) ;
          return 1 ;
        }
        return 0 ;
      }